

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

SmallVector<spirv_cross::SPIRBlock::Case,_8UL> * __thiscall
spirv_cross::Compiler::get_case_list(Compiler *this,SPIRBlock *block)

{
  ID *__k;
  SPIRConstant *pSVar1;
  SPIRConstantOp *pSVar2;
  SPIRType *pSVar3;
  const_iterator cVar4;
  uint32_t *puVar5;
  CompilerError *this_00;
  SmallVector<spirv_cross::SPIRBlock::Case,_8UL> *pSVar6;
  uint32_t id;
  
  pSVar1 = maybe_get<spirv_cross::SPIRConstant>(this,(block->condition).id);
  if (pSVar1 == (SPIRConstant *)0x0) {
    __k = &block->condition;
    pSVar2 = maybe_get<spirv_cross::SPIRConstantOp>(this,__k->id);
    if (pSVar2 == (SPIRConstantOp *)0x0) {
      pSVar1 = (SPIRConstant *)maybe_get<spirv_cross::SPIRVariable>(this,__k->id);
      if (pSVar1 == (SPIRConstant *)0x0) {
        pSVar1 = (SPIRConstant *)maybe_get<spirv_cross::SPIRUndef>(this,__k->id);
        if (pSVar1 == (SPIRConstant *)0x0) {
          cVar4 = ::std::
                  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&(this->ir).load_type_width._M_h,__k);
          if (cVar4.
              super__Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int>,_true>
              ._M_cur == (__node_type *)0x0) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (this_00,"Use of undeclared variable on a switch statement.");
            __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          puVar5 = (uint32_t *)
                   ((long)cVar4.
                          super__Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int>,_true>
                          ._M_cur + 0xc);
          goto LAB_00284ef0;
        }
      }
      goto LAB_00284ec8;
    }
    id = (pSVar2->basetype).id;
  }
  else {
LAB_00284ec8:
    id = *(uint32_t *)&(pSVar1->super_IVariant).field_0xc;
  }
  pSVar3 = get<spirv_cross::SPIRType>(this,id);
  puVar5 = &pSVar3->width;
LAB_00284ef0:
  pSVar6 = &block->cases_64bit;
  if (*puVar5 < 0x21) {
    pSVar6 = &block->cases_32bit;
  }
  return pSVar6;
}

Assistant:

const SmallVector<SPIRBlock::Case> &Compiler::get_case_list(const SPIRBlock &block) const
{
	uint32_t width = 0;

	// First we check if we can get the type directly from the block.condition
	// since it can be a SPIRConstant or a SPIRVariable.
	if (const auto *constant = maybe_get<SPIRConstant>(block.condition))
	{
		const auto &type = get<SPIRType>(constant->constant_type);
		width = type.width;
	}
	else if (const auto *op = maybe_get<SPIRConstantOp>(block.condition))
	{
		const auto &type = get<SPIRType>(op->basetype);
		width = type.width;
	}
	else if (const auto *var = maybe_get<SPIRVariable>(block.condition))
	{
		const auto &type = get<SPIRType>(var->basetype);
		width = type.width;
	}
	else if (const auto *undef = maybe_get<SPIRUndef>(block.condition))
	{
		const auto &type = get<SPIRType>(undef->basetype);
		width = type.width;
	}
	else
	{
		auto search = ir.load_type_width.find(block.condition);
		if (search == ir.load_type_width.end())
		{
			SPIRV_CROSS_THROW("Use of undeclared variable on a switch statement.");
		}

		width = search->second;
	}

	if (width > 32)
		return block.cases_64bit;

	return block.cases_32bit;
}